

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3IncrmergeAppend(Fts3Table *p,IncrmergeWriter *pWriter,Fts3MultiSegReader *pCsr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  NodeWriter *pNVar6;
  NodeWriter *pLeaf;
  int nSuffix;
  int nPrefix;
  int nSpace;
  int rc;
  int nDoclist;
  char *aDoclist;
  char *pcStack_28;
  int nTerm;
  char *zTerm;
  Fts3MultiSegReader *pCsr_local;
  IncrmergeWriter *pWriter_local;
  Fts3Table *p_local;
  
  pcStack_28 = pCsr->zTerm;
  aDoclist._4_4_ = pCsr->nTerm;
  _rc = pCsr->aDoclist;
  nSpace = pCsr->nDoclist;
  nPrefix = 0;
  pNVar6 = pWriter->aNodeWriter;
  zTerm = (char *)pCsr;
  pCsr_local = (Fts3MultiSegReader *)pWriter;
  pWriter_local = (IncrmergeWriter *)p;
  iVar1 = fts3PrefixCompress(pWriter->aNodeWriter[0].key.a,pWriter->aNodeWriter[0].key.n,pcStack_28,
                             aDoclist._4_4_);
  iVar2 = aDoclist._4_4_ - iVar1;
  iVar3 = sqlite3Fts3VarintLen((long)iVar1);
  iVar4 = sqlite3Fts3VarintLen((long)iVar2);
  iVar5 = sqlite3Fts3VarintLen((long)nSpace);
  nSuffix = iVar5 + nSpace + iVar4 + iVar2 + iVar3;
  if ((0 < pWriter->aNodeWriter[0].block.n) &&
     (pWriter_local->aNodeWriter[9].block.n < pWriter->aNodeWriter[0].block.n + nSuffix)) {
    nPrefix = fts3WriteSegment((Fts3Table *)pWriter_local,pNVar6->iBlock,
                               pWriter->aNodeWriter[0].block.a,pWriter->aNodeWriter[0].block.n);
    *(int *)((long)&pCsr_local->apSegment + 4) = *(int *)((long)&pCsr_local->apSegment + 4) + 1;
    if (nPrefix == 0) {
      nPrefix = fts3IncrmergePush((Fts3Table *)pWriter_local,(IncrmergeWriter *)pCsr_local,
                                  pcStack_28,iVar1 + 1);
    }
    iVar1 = aDoclist._4_4_;
    pNVar6->iBlock = pNVar6->iBlock + 1;
    pWriter->aNodeWriter[0].key.n = 0;
    pWriter->aNodeWriter[0].block.n = 0;
    iVar2 = sqlite3Fts3VarintLen((long)aDoclist._4_4_);
    iVar3 = sqlite3Fts3VarintLen((long)nSpace);
    nSuffix = iVar3 + nSpace + iVar2 + iVar1 + 1;
  }
  *(long *)&pCsr_local->bRestart = (long)nSuffix + *(long *)&pCsr_local->bRestart;
  blobGrowBuffer(&pWriter->aNodeWriter[0].block,pWriter->aNodeWriter[0].block.n + nSuffix,&nPrefix);
  if (nPrefix == 0) {
    if (pWriter->aNodeWriter[0].block.n == 0) {
      pWriter->aNodeWriter[0].block.n = 1;
      *pWriter->aNodeWriter[0].block.a = '\0';
    }
    nPrefix = fts3AppendToNode(&pWriter->aNodeWriter[0].block,&pWriter->aNodeWriter[0].key,
                               pcStack_28,aDoclist._4_4_,_rc,nSpace);
  }
  return nPrefix;
}

Assistant:

static int fts3IncrmergeAppend(
  Fts3Table *p,                   /* Fts3 table handle */
  IncrmergeWriter *pWriter,       /* Writer object */
  Fts3MultiSegReader *pCsr        /* Cursor containing term and doclist */
){
  const char *zTerm = pCsr->zTerm;
  int nTerm = pCsr->nTerm;
  const char *aDoclist = pCsr->aDoclist;
  int nDoclist = pCsr->nDoclist;
  int rc = SQLITE_OK;           /* Return code */
  int nSpace;                   /* Total space in bytes required on leaf */
  int nPrefix;                  /* Size of prefix shared with previous term */
  int nSuffix;                  /* Size of suffix (nTerm - nPrefix) */
  NodeWriter *pLeaf;            /* Object used to write leaf nodes */

  pLeaf = &pWriter->aNodeWriter[0];
  nPrefix = fts3PrefixCompress(pLeaf->key.a, pLeaf->key.n, zTerm, nTerm);
  nSuffix = nTerm - nPrefix;

  nSpace  = sqlite3Fts3VarintLen(nPrefix);
  nSpace += sqlite3Fts3VarintLen(nSuffix) + nSuffix;
  nSpace += sqlite3Fts3VarintLen(nDoclist) + nDoclist;

  /* If the current block is not empty, and if adding this term/doclist
  ** to the current block would make it larger than Fts3Table.nNodeSize
  ** bytes, write this block out to the database. */
  if( pLeaf->block.n>0 && (pLeaf->block.n + nSpace)>p->nNodeSize ){
    rc = fts3WriteSegment(p, pLeaf->iBlock, pLeaf->block.a, pLeaf->block.n);
    pWriter->nWork++;

    /* Add the current term to the parent node. The term added to the 
    ** parent must:
    **
    **   a) be greater than the largest term on the leaf node just written
    **      to the database (still available in pLeaf->key), and
    **
    **   b) be less than or equal to the term about to be added to the new
    **      leaf node (zTerm/nTerm).
    **
    ** In other words, it must be the prefix of zTerm 1 byte longer than
    ** the common prefix (if any) of zTerm and pWriter->zTerm.
    */
    if( rc==SQLITE_OK ){
      rc = fts3IncrmergePush(p, pWriter, zTerm, nPrefix+1);
    }

    /* Advance to the next output block */
    pLeaf->iBlock++;
    pLeaf->key.n = 0;
    pLeaf->block.n = 0;

    nSuffix = nTerm;
    nSpace  = 1;
    nSpace += sqlite3Fts3VarintLen(nSuffix) + nSuffix;
    nSpace += sqlite3Fts3VarintLen(nDoclist) + nDoclist;
  }

  pWriter->nLeafData += nSpace;
  blobGrowBuffer(&pLeaf->block, pLeaf->block.n + nSpace, &rc);
  if( rc==SQLITE_OK ){
    if( pLeaf->block.n==0 ){
      pLeaf->block.n = 1;
      pLeaf->block.a[0] = '\0';
    }
    rc = fts3AppendToNode(
        &pLeaf->block, &pLeaf->key, zTerm, nTerm, aDoclist, nDoclist
    );
  }

  return rc;
}